

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::End(void)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  uint uVar7;
  ImGuiContext *g;
  int iVar8;
  ImGuiViewportP *in_RSI;
  float fVar9;
  ImVec2 IVar10;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((1 < (GImGui->CurrentWindowStack).Size) ||
     (GImGui->WithinFrameScopeWithImplicitWindow == false)) {
    if ((pIVar3->DC).CurrentColumns != (ImGuiColumns *)0x0) {
      EndColumns();
    }
    uVar7 = pIVar3->Flags;
    if ((uVar7 >> 0x1d & 1) == 0) {
      PopClipRect();
      uVar7 = pIVar3->Flags;
    }
    if ((uVar7 >> 0x18 & 1) == 0) {
      LogFinish();
    }
    if (((pIVar3->DockNode != (ImGuiDockNode *)0x0) && ((pIVar3->field_0x43a & 2) != 0)) &&
       (pIVar4 = pIVar3->DockNode->HostWindow, pIVar4 != (ImGuiWindow *)0x0)) {
      IVar1 = (pIVar3->DC).CursorMaxPos;
      IVar10.x = (IVar1.x + (pIVar3->WindowPadding).x) - (pIVar4->WindowPadding).x;
      IVar10.y = (IVar1.y + (pIVar3->WindowPadding).y) - (pIVar4->WindowPadding).y;
      (pIVar4->DC).CursorMaxPos = IVar10;
    }
    iVar2 = (pIVar5->CurrentWindowStack).Size;
    iVar8 = iVar2 + -1;
    (pIVar5->CurrentWindowStack).Size = iVar8;
    if ((pIVar3->Flags & 0x4000000) != 0) {
      (pIVar5->BeginPopupStack).Size = (pIVar5->BeginPopupStack).Size + -1;
    }
    pIVar6 = GImGui;
    if (iVar8 == 0) {
      GImGui->CurrentWindow = (ImGuiWindow *)0x0;
    }
    else {
      pIVar3 = (pIVar5->CurrentWindowStack).Data[(long)iVar2 + -2];
      GImGui->CurrentWindow = pIVar3;
      if (pIVar3 != (ImGuiWindow *)0x0) {
        fVar9 = pIVar6->FontBaseSize * pIVar3->FontWindowScale * pIVar3->FontDpiScale;
        if (pIVar3->ParentWindow != (ImGuiWindow *)0x0) {
          fVar9 = fVar9 * pIVar3->ParentWindow->FontWindowScale;
        }
        (pIVar6->DrawListSharedData).FontSize = fVar9;
        pIVar6->FontSize = fVar9;
      }
    }
    if (pIVar5->CurrentWindow != (ImGuiWindow *)0x0) {
      SetCurrentViewport((ImGuiWindow *)pIVar5->CurrentWindow->Viewport,in_RSI);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    ErrorCheckBeginEndCompareStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}